

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Handle __thiscall soul::Value::getUnsizedArrayContent(Value *this)

{
  long lVar1;
  PackedData local_28;
  Value *local_10;
  Value *this_local;
  
  local_10 = this;
  getData(&local_28,this);
  lVar1 = PackedData::getAs<long>(&local_28);
  return lVar1;
}

Assistant:

ConstantTable::Handle Value::getUnsizedArrayContent() const { return getData().getAs<ConstantTable::Handle>(); }